

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_hash.c
# Opt level: O2

void gravity_hash_free(gravity_hash_t *hashtable)

{
  gravity_hash_iterate_fn p_Var1;
  hash_node_t **__ptr;
  hash_node_s *phVar2;
  uint32_t n;
  ulong uVar3;
  hash_node_t *__ptr_00;
  
  if (hashtable != (gravity_hash_t *)0x0) {
    p_Var1 = hashtable->free_fn;
    for (uVar3 = 0; __ptr = hashtable->nodes, uVar3 < hashtable->size; uVar3 = uVar3 + 1) {
      __ptr_00 = __ptr[uVar3];
      __ptr[uVar3] = (hash_node_t *)0x0;
      while (__ptr_00 != (hash_node_t *)0x0) {
        if (p_Var1 != (gravity_hash_iterate_fn)0x0) {
          (*p_Var1)(hashtable,__ptr_00->key,__ptr_00->value,hashtable->data);
        }
        phVar2 = __ptr_00->next;
        free(__ptr_00);
        __ptr_00 = phVar2;
      }
    }
    free(__ptr);
    free(hashtable);
    return;
  }
  return;
}

Assistant:

void gravity_hash_free (gravity_hash_t *hashtable) {
    if (!hashtable) return;
    gravity_hash_iterate_fn free_fn = hashtable->free_fn;

    for (uint32_t n = 0; n < hashtable->size; ++n) {
        hash_node_t *node = hashtable->nodes[n];
        hashtable->nodes[n] = NULL;
        while (node) {
            if (free_fn) free_fn(hashtable, node->key, node->value, hashtable->data);
            hash_node_t *old_node = node;
            node = node->next;
            mem_free(old_node);
        }
    }
    mem_free(hashtable->nodes);
    mem_free(hashtable);
    hashtable = NULL;
}